

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void __thiscall
kratos::PortLegalityFixVisitor::~PortLegalityFixVisitor(PortLegalityFixVisitor *this)

{
  PortLegalityFixVisitor *this_local;
  
  ~PortLegalityFixVisitor(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

void visit(Generator* gen) override {
        auto const* parent_gen = gen->parent_generator();
        auto port_names = gen->get_port_names();
        for (auto const& port_name : port_names) {
            auto const& port = gen->get_port(port_name);
            if (port->port_direction() != PortDirection::In) continue;
            auto sinks = std::unordered_set(port->sinks().begin(), port->sinks().end());
            for (auto const& stmt : sinks) {
                if (stmt->generator_parent() != parent_gen) continue;
                // if we have any sinks that's in the parent scope, it's an illegal assignment
                // we have to figure out the source
                auto const& sources = port->sources();
                if (sources.empty()) continue;
                auto const& src = (*sources.begin())->right()->shared_from_this();
                if (src->generator() != parent_gen)
                    throw InternalException("Invalid src generator");
                // replace the source with this src
                // depends on the context, it could be an auxiliary stmt
                if (port->generator()->is_auxiliary_var(stmt->left()->shared_from_this())) {
                    auto* parent_stmt = reinterpret_cast<Stmt*>(stmt->parent());
                    if (parent_stmt->type() == StatementType::If) {
                        auto if_ = parent_stmt->as<IfStmt>();
                        if (if_->predicate()->type() == VarType::Expression) {
                            auto expr = if_->predicate()->as<Expr>();
                            change_var_expr(expr, port.get(), src.get(), false);
                        } else {
                            if_->set_predicate(src);
                        }
                    } else {
                        // case statement
                        auto case_ = parent_stmt->as<SwitchStmt>();
                        if (case_->target()->type() == VarType::Expression) {
                            auto expr = case_->target()->as<Expr>();
                            change_var_expr(expr, port.get(), src.get(), false);
                        } else {
                            case_->set_target(src);
                        }
                    }
                } else {
                    auto* right = stmt->right();
                    if (right->type() == VarType::Expression) {
                        auto expr = right->as<Expr>();
                        change_var_expr(expr, port.get(), src.get(), false);
                    } else {
                        stmt->right() = src.get();
                    }
                }
            }
        }
    }